

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

CFGNode * __thiscall dxil_spv::CFGNode::get_outer_selection_dominator(CFGNode *this)

{
  CFGNode **ppCVar1;
  Type TVar2;
  CFGNode *pCVar3;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  _Var4;
  CFGNode *pCVar5;
  CFGNode *pCVar6;
  
  pCVar6 = this->immediate_dominator;
  if (pCVar6 == (CFGNode *)0x0) {
    __assert_fail("immediate_dominator",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/node.cpp"
                  ,0x254,"CFGNode *dxil_spv::CFGNode::get_outer_selection_dominator()");
  }
  TVar2 = (pCVar6->ir).terminator.type;
  do {
    pCVar3 = pCVar6;
    if (TVar2 == Switch) {
      return pCVar6;
    }
    do {
      pCVar5 = pCVar3;
      if (pCVar5 == this) goto LAB_0014cb5e;
      pCVar3 = pCVar5->immediate_post_dominator;
    } while ((pCVar3 != (CFGNode *)0x0) && (pCVar5 != pCVar3));
    if (pCVar5 != this) {
      return pCVar6;
    }
LAB_0014cb5e:
    if ((pCVar6->pred).
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pCVar6->pred).
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return pCVar6;
    }
    while( true ) {
      ppCVar1 = &pCVar6->immediate_dominator;
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<dxil_spv::CFGNode*const>>
                        ((pCVar6->headers).
                         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pCVar6->headers).
                         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,ppCVar1);
      pCVar3 = pCVar6;
      if (_Var4._M_current ==
          (pCVar6->headers).
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) break;
      pCVar6 = *ppCVar1;
    }
    do {
      pCVar5 = pCVar3;
      if (pCVar5 == this) goto LAB_0014cbba;
      pCVar3 = pCVar5->immediate_post_dominator;
    } while ((pCVar3 != (CFGNode *)0x0) && (pCVar5 != pCVar3));
    if (pCVar5 == this) {
LAB_0014cbba:
      pCVar6 = *ppCVar1;
      if (pCVar6 == (CFGNode *)0x0) {
        __assert_fail("node->immediate_dominator",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/node.cpp"
                      ,0x264,"CFGNode *dxil_spv::CFGNode::get_outer_selection_dominator()");
      }
    }
    TVar2 = (pCVar6->ir).terminator.type;
  } while( true );
}

Assistant:

CFGNode *CFGNode::get_outer_selection_dominator()
{
	assert(immediate_dominator);
	auto *node = immediate_dominator;

	// We need to find an immediate dominator which we do not post-dominate.
	// That first idom is considered the outer selection header.
	while (node->ir.terminator.type != Terminator::Type::Switch && post_dominates(node))
	{
		if (node->pred.empty())
			break;

		// Skip from merge block to header.
		while (std::find(node->headers.begin(), node->headers.end(), node->immediate_dominator) != node->headers.end())
			node = node->immediate_dominator;

		if (post_dominates(node))
		{
			assert(node->immediate_dominator);
			node = node->immediate_dominator;
		}
	}

	return node;
}